

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_insert_array(map m,map_key *keys,map_value *values,size_t size)

{
  int iVar1;
  map_value in_RCX;
  map_key in_RDX;
  map in_RSI;
  long in_RDI;
  size_t iterator;
  map_value local_30;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == (map)0x0)) || (in_RDX == (map_key)0x0)) {
    log_write_impl_va("metacall",0xde,"map_insert_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,"Invalid map insertion parameters");
    local_4 = 1;
  }
  else {
    for (local_30 = (map_value)0x0; local_30 < in_RCX; local_30 = (map_value)((long)local_30 + 1)) {
      iVar1 = map_insert(in_RSI,in_RDX,in_RCX);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0xe6,"map_insert_array",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                          ,LOG_LEVEL_ERROR,"Invalid map array insertion");
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int map_insert_array(map m, map_key keys[], map_value values[], size_t size)
{
	size_t iterator;

	if (m == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (map_insert(m, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map array insertion");
			return 1;
		}
	}

	return 0;
}